

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_replay_linux.hpp
# Opt level: O0

int run_slave_process(Options *opts,Options *replayer_opts,
                     vector<const_char_*,_std::allocator<const_char_*>_> *databases)

{
  int iVar1;
  char *pcVar2;
  int *piVar3;
  undefined1 local_1170 [4];
  int ret;
  sigset_t old_mask;
  sigset_t mask;
  undefined1 local_1068 [8];
  sigaction act;
  unsigned_long_long hash;
  char ignored_shader_module_hash [18];
  ThreadedReplayer replayer;
  Options tmp_opts;
  undefined8 local_38;
  size_t local_30;
  vector<const_char_*,_std::allocator<const_char_*>_> *databases_local;
  Options *replayer_opts_local;
  Options *opts_local;
  
  memset(&tmp_opts.timeout_seconds,0,0x18);
  alt_stack.ss_sp = (void *)tmp_opts._336_8_;
  alt_stack._8_8_ = local_38;
  alt_stack.ss_size = local_30;
  alt_stack.ss_sp = malloc(0x100000);
  alt_stack.ss_size = 0x100000;
  alt_stack._8_8_ = alt_stack._8_8_ & 0xffffffff00000000;
  iVar1 = sigaltstack((sigaltstack *)&alt_stack,(sigaltstack *)0x0);
  if (iVar1 < 0) {
    return 1;
  }
  ThreadedReplayer::Options::Options((Options *)&replayer.global_database,replayer_opts);
  tmp_opts.control_block = (SharedControlBlock *)thread_callback;
  tmp_opts.on_thread_callback_userdata = validation_error_cb;
  ThreadedReplayer::ThreadedReplayer
            ((ThreadedReplayer *)(ignored_shader_module_hash + 0x10),opts,
             (Options *)&replayer.global_database);
  replayer.device_opts.features._0_1_ = 1;
  while (pcVar2 = fgets((char *)&hash,0x12,_stdin), pcVar2 != (char *)0x0) {
    piVar3 = __errno_location();
    *piVar3 = 0;
    act.sa_restorer = (_func_void *)strtoull((char *)&hash,(char **)0x0,0x10);
    if (act.sa_restorer == (_func_void *)0x0) break;
    piVar3 = __errno_location();
    if (*piVar3 == 0) {
      ThreadedReplayer::mask_shader_module
                ((ThreadedReplayer *)(ignored_shader_module_hash + 0x10),(Hash)act.sa_restorer);
    }
  }
  crash_fd = dup(1);
  close(1);
  global_replayer = (ThreadedReplayer *)(ignored_shader_module_hash + 0x10);
  if ((replayer_opts->disable_signal_handler & 1U) == 0) {
    memset(local_1068,0,0x98);
    sigemptyset((sigset_t *)&act);
    local_1068 = (undefined1  [8])crash_handler;
    act.sa_mask.__val[0xf]._0_4_ = 0x88000000;
    iVar1 = sigaction(0xb,(sigaction *)local_1068,(sigaction *)0x0);
    if (iVar1 < 0) {
      opts_local._4_4_ = 1;
      goto LAB_00127018;
    }
    iVar1 = sigaction(8,(sigaction *)local_1068,(sigaction *)0x0);
    if (iVar1 < 0) {
      opts_local._4_4_ = 1;
      goto LAB_00127018;
    }
    iVar1 = sigaction(4,(sigaction *)local_1068,(sigaction *)0x0);
    if (iVar1 < 0) {
      opts_local._4_4_ = 1;
      goto LAB_00127018;
    }
    iVar1 = sigaction(7,(sigaction *)local_1068,(sigaction *)0x0);
    if (iVar1 < 0) {
      opts_local._4_4_ = 1;
      goto LAB_00127018;
    }
    iVar1 = sigaction(6,(sigaction *)local_1068,(sigaction *)0x0);
    if (iVar1 < 0) {
      opts_local._4_4_ = 1;
      goto LAB_00127018;
    }
  }
  sigemptyset((sigset_t *)(old_mask.__val + 0xf));
  sigaddset((sigset_t *)(old_mask.__val + 0xf),6);
  iVar1 = pthread_sigmask(0,(__sigset_t *)(old_mask.__val + 0xf),(__sigset_t *)local_1170);
  if (iVar1 < 0) {
    opts_local._4_4_ = 1;
  }
  else {
    opts_local._4_4_ =
         run_normal_process((ThreadedReplayer *)(ignored_shader_module_hash + 0x10),databases,
                            (char *)0x0,0,(long)Global::metadata_fd);
    global_replayer = (ThreadedReplayer *)0x0;
    if ((replayer_opts->disable_signal_handler & 1U) == 0) {
      signal(0xb,(__sighandler_t)0x0);
      signal(8,(__sighandler_t)0x0);
      signal(4,(__sighandler_t)0x0);
      signal(7,(__sighandler_t)0x0);
      signal(6,(__sighandler_t)0x0);
    }
    pthread_sigmask(2,(__sigset_t *)local_1170,(__sigset_t *)0x0);
    free(alt_stack.ss_sp);
  }
LAB_00127018:
  ThreadedReplayer::~ThreadedReplayer((ThreadedReplayer *)(ignored_shader_module_hash + 0x10));
  ThreadedReplayer::Options::~Options((Options *)&replayer.global_database);
  return opts_local._4_4_;
}

Assistant:

static int run_slave_process(const VulkanDevice::Options &opts,
                             const ThreadedReplayer::Options &replayer_opts,
                             const vector<const char *> &databases)
{
	// Just in case the driver crashed due to stack overflow,
	// provide an alternate stack where we can clean up "safely".
	alt_stack = {};
	alt_stack.ss_sp = malloc(1024 * 1024);
	alt_stack.ss_size = 1024 * 1024;
	alt_stack.ss_flags = 0;
	if (sigaltstack(&alt_stack, nullptr) < 0)
		return EXIT_FAILURE;

	auto tmp_opts = replayer_opts;
	tmp_opts.on_thread_callback = thread_callback;
	tmp_opts.on_validation_error_callback = validation_error_cb;
	ThreadedReplayer replayer(opts, tmp_opts);
	replayer.robustness = true;

	// In slave mode, we can receive a list of shader module hashes we should ignore.
	// This is to avoid trying to replay the same faulty shader modules again and again.
	char ignored_shader_module_hash[16 + 2];
	while (fgets(ignored_shader_module_hash, sizeof(ignored_shader_module_hash), stdin))
	{
		errno = 0;
		auto hash = strtoull(ignored_shader_module_hash, nullptr, 16);
		if (hash == 0)
			break;
		if (errno == 0)
		{
			//LOGE("Ignoring module %llx\n", hash);
			replayer.mask_shader_module(Hash(hash));
		}
	}

	// Make sure that the driver cannot mess up the master process by writing random data to stdout.
	crash_fd = dup(STDOUT_FILENO);
	close(STDOUT_FILENO);

	global_replayer = &replayer;

	if (!replayer_opts.disable_signal_handler)
	{
		// Install the signal handlers.
		// It's very important that this runs in a single thread,
		// so we cannot have some rogue thread overriding these handlers.
		struct sigaction act;
		memset(&act, 0, sizeof(act));
		sigemptyset(&act.sa_mask);
		act.sa_handler = crash_handler;
		act.sa_flags = SA_RESETHAND | SA_ONSTACK;

		if (sigaction(SIGSEGV, &act, nullptr) < 0)
			return EXIT_FAILURE;
		if (sigaction(SIGFPE, &act, nullptr) < 0)
			return EXIT_FAILURE;
		if (sigaction(SIGILL, &act, nullptr) < 0)
			return EXIT_FAILURE;
		if (sigaction(SIGBUS, &act, nullptr) < 0)
			return EXIT_FAILURE;
		if (sigaction(SIGABRT, &act, nullptr) < 0)
			return EXIT_FAILURE;
	}

	// Don't allow the main thread to handle abort signals.
	sigset_t mask;
	sigemptyset(&mask);
	sigaddset(&mask, SIGABRT);
	sigset_t old_mask;
	if (pthread_sigmask(SIG_BLOCK, &mask, &old_mask) < 0)
		return EXIT_FAILURE;

	int ret = run_normal_process(replayer, databases, nullptr, 0, Global::metadata_fd);
	global_replayer = nullptr;

	if (!replayer_opts.disable_signal_handler)
	{
		// Cannot reliably handle these signals if they occur during teardown of the process.
		signal(SIGSEGV, SIG_DFL);
		signal(SIGFPE, SIG_DFL);
		signal(SIGILL, SIG_DFL);
		signal(SIGBUS, SIG_DFL);
		signal(SIGABRT, SIG_DFL);
	}
	pthread_sigmask(SIG_SETMASK, &old_mask, nullptr);

	free(alt_stack.ss_sp);

#if 0
	if (Global::control_block)
	{
		futex_wrapper_lock(&Global::control_block->futex_lock);
		char msg[ControlBlockMessageSize] = {};
		sprintf(msg, "SLAVE_FINISHED\n");
		shared_control_block_write(Global::control_block, msg, sizeof(msg));
		futex_wrapper_unlock(&Global::control_block->futex_lock);
	}
#endif

	return ret;
}